

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O0

double aom_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,int height)

{
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  int in_R8D;
  int in_R9D;
  double dVar1;
  double v;
  double ssim_total;
  int samples;
  int j;
  int i;
  double local_38;
  int local_2c;
  int local_28;
  int rp;
  
  local_2c = 0;
  local_38 = 0.0;
  for (rp = 0; rp <= in_R9D + -8; rp = rp + 4) {
    for (local_28 = 0; local_28 <= in_R8D + -8; local_28 = local_28 + 4) {
      dVar1 = ssim_8x8(in_RSI,in_EDX,(uint8_t *)CONCAT44(in_R8D,in_R9D),rp);
      local_38 = dVar1 + local_38;
      local_2c = local_2c + 1;
    }
    in_RSI = in_RSI + (in_ECX << 2);
  }
  return local_38 / (double)local_2c;
}

Assistant:

double aom_ssim2(const uint8_t *img1, const uint8_t *img2, int stride_img1,
                 int stride_img2, int width, int height) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = ssim_8x8(img1 + j, stride_img1, img2 + j, stride_img2);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}